

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetAmpEnableMask(AmpIO *this,uint32_t mask,uint32_t state)

{
  uint32_t uVar1;
  uint local_28;
  uint i;
  uint32_t state_set_mask;
  uint32_t state_clr_mask;
  uint32_t enable_mask;
  uint32_t state_local;
  uint32_t mask_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 8) {
    this->WriteBuffer[this->WB_CTRL_OFFSET] =
         this->WriteBuffer[this->WB_CTRL_OFFSET] & (mask ^ 0xffffffff) | mask << 8 | state;
  }
  else {
    for (local_28 = 0; local_28 < this->NumMotors; local_28 = local_28 + 1) {
      if ((mask >> ((byte)local_28 & 0x1f) & 1) != 0) {
        SetAmpEnable(this,local_28,(state >> ((byte)local_28 & 0x1f) & 1) != 0);
      }
    }
  }
  return true;
}

Assistant:

bool AmpIO::SetAmpEnableMask(uint32_t mask, uint32_t state)
{
    if (GetFirmwareVersion() < 8) {
        uint32_t enable_mask = static_cast<uint32_t>(mask) << 8;
        uint32_t state_clr_mask = static_cast<uint32_t>(mask);
        uint32_t state_set_mask = static_cast<uint32_t>(state);
        // Following will correctly handle case where SetAmpEnable/SetAmpEnableMask is called multiple times,
        // with different masks
        WriteBuffer[WB_CTRL_OFFSET] = (WriteBuffer[WB_CTRL_OFFSET]&(~state_clr_mask)) | enable_mask | state_set_mask;
    }
    else {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if ((mask >> i) & 1)
                SetAmpEnable(i, (state >> i) & 1);
        }
    }
    return true;
}